

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O3

void __thiscall pm::Sampler::~Sampler(Sampler *this)

{
  pointer puVar1;
  pointer pVVar2;
  pointer pVVar3;
  
  this->_vptr_Sampler = (_func_int **)&PTR__Sampler_00114ab0;
  puVar1 = (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->shuffledIndices_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pVVar2 = (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->hemisphereSamples_).
                                 super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  pVVar3 = (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->diskSamples_).
                                 super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  pVVar3 = (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->samples_).
                                 super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
    return;
  }
  return;
}

Assistant:

virtual ~Sampler() {}